

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void draw_spinning_triangle(void)

{
  uint uVar1;
  float mvp [16];
  float local_a8 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  
  uVar1 = SDL_GetTicks();
  GPU_Rotate(((float)uVar1 / 1000.0) * 100.0,0.0,0.707,0.707);
  GPU_Rotate(((float)uVar1 / 1000.0) * 20.0,0.707,0.707,0.0);
  local_68 = 0x3e4ccccd00000000;
  uStack_60 = 0x3f80000000000000;
  local_58 = 0;
  uStack_50 = 0xbe4ccccd3f800000;
  local_48 = 0xbe4ccccd;
  uStack_40 = 0x3f80000000000000;
  local_38 = 0x3f80000000000000;
  uStack_30 = 0xbe4ccccd3e4ccccd;
  local_28 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0x3f800000;
  local_18 = 0x3f800000;
  (*__glewUseProgramObjectARB)(p);
  GPU_GetModelViewProjection(local_a8);
  (*__glewUniformMatrix4fvARB)(modelViewProjection_loc,1,'\0',local_a8);
  (*__glewEnableVertexAttribArrayARB)(vertex_loc);
  (*__glewEnableVertexAttribArrayARB)(color_loc);
  (*__glewBindBufferARB)(0x8892,VBO);
  (*__glewBufferDataARB)(0x8892,0x54,&local_68,0x88e0);
  (*__glewVertexAttribPointerARB)(vertex_loc,3,0x1406,'\0',0x1c,(void *)0x0);
  (*__glewVertexAttribPointerARB)(color_loc,4,0x1406,'\0',0x1c,(void *)0xc);
  glDrawArrays(4,0,3);
  (*__glewDisableVertexAttribArrayARB)(color_loc);
  (*__glewDisableVertexAttribArrayARB)(vertex_loc);
  return;
}

Assistant:

void draw_spinning_triangle()
{
    GLfloat gldata[21];
    float mvp[16];
    float t = SDL_GetTicks()/1000.0f;

    GPU_Rotate(100*t, 0, 0.707, 0.707);
    GPU_Rotate(20*t, 0.707, 0.707, 0);


    gldata[0] = 0;
    gldata[1] = 0.2f;
    gldata[2] = 0;
    
    gldata[3] = 1.0f;
    gldata[4] = 0.0f;
    gldata[5] = 0.0f;
    gldata[6] = 1.0f;
    
    
    gldata[7] = -0.2f;
    gldata[8] = -0.2f;
    gldata[9] = 0;
    
    gldata[10] = 0.0f;
    gldata[11] = 1.0f;
    gldata[12] = 0.0f;
    gldata[13] = 1.0f;
    
    gldata[14] = 0.2f;
    gldata[15] = -0.2f;
    gldata[16] = 0;
    gldata[17] = 0.0f;
    gldata[18] = 0.0f;
    gldata[19] = 1.0f;
    gldata[20] = 1.0f;
    
    
    glUseProgram(p);
    
    GPU_GetModelViewProjection(mvp);
    glUniformMatrix4fv(modelViewProjection_loc, 1, 0, mvp);
    
    
    glEnableVertexAttribArray(vertex_loc);
    glEnableVertexAttribArray(color_loc);
    
    glBindBuffer(GL_ARRAY_BUFFER, VBO);
    glBufferData(GL_ARRAY_BUFFER, sizeof(gldata), gldata, GL_STREAM_DRAW);
    
    glVertexAttribPointer(
       vertex_loc,
       3,                  // size
       GL_FLOAT,           // type
       GL_FALSE,           // normalize
       sizeof(float)*7,    // stride
       (void*)0            // offset
    );
    
    glVertexAttribPointer(
       color_loc,
       4,                      // size
       GL_FLOAT,               // type
       GL_FALSE,               // normalize
       sizeof(float)*7,        // stride
       (void*)(sizeof(float)*3)  // offset
    );
    
    glDrawArrays(GL_TRIANGLES, 0, 3);
     
    glDisableVertexAttribArray(color_loc);
    glDisableVertexAttribArray(vertex_loc);
}